

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O2

bool __thiscall MP1Node::joinReqHandler(MP1Node *this,void *env,char *data,int size)

{
  long heartbeat;
  short port;
  int id;
  ostream *poVar1;
  MP1Node *pMVar2;
  Address requesterAddress;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  string reqAddStr;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"start joinReqHandler...");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (size < 0xe) {
    Log::LOG(this->log,&this->memberNode->addr,"Message JOINREQ received with size wrong. Ignored.")
    ;
  }
  else {
    requesterAddress.addr._4_2_ = *(undefined2 *)(data + 4);
    requesterAddress.addr._0_4_ = *(undefined4 *)data;
    heartbeat = *(long *)(data + 6);
    Address::getAddress_abi_cxx11_(&reqAddStr,&requesterAddress);
    pMVar2 = (MP1Node *)local_68;
    std::__cxx11::string::string((string *)pMVar2,(string *)&reqAddStr);
    id = getIdFromAddress(pMVar2,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    pMVar2 = (MP1Node *)local_88;
    std::__cxx11::string::string((string *)pMVar2,(string *)&reqAddStr);
    port = getPortFromAddress(pMVar2,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    updateMembershipList(this,id,port,heartbeat);
    sendMembershipList(this,&requesterAddress,JOINREP);
    poVar1 = std::operator<<((ostream *)&std::cout,"...end joinReqHandler.");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&reqAddStr);
  }
  return 0xd < size;
}

Assistant:

bool MP1Node::joinReqHandler(void *env, char *data, int size) {
    cout << "start joinReqHandler..." << endl;

    if (size < (int)(sizeof(memberNode->addr.addr) + sizeof(long))) {
#ifdef DEBUGLOG
        log->LOG(&memberNode->addr, "Message JOINREQ received with size wrong. Ignored.");
#endif
        return false;
    }

    //Get requester information
    //message structure ---> MsgType, address, number of members, member data (id, port, heartbeat)
    Address requesterAddress;
    memcpy(requesterAddress.addr, data, sizeof(memberNode->addr.addr));     //extract requester's Address from data
    data += sizeof(memberNode->addr.addr);
    size -= sizeof(memberNode->addr.addr);

    long heartbeat;
    memcpy(&heartbeat, data, sizeof(long));   //extract heartbeat from data
    //data += sizeof(long);
    //size -= sizeof(long);

    //Get id and port
    string reqAddStr = (requesterAddress.getAddress());
    int id = getIdFromAddress(reqAddStr);
    short port = getPortFromAddress(reqAddStr);

    //update the member in the membership list
    updateMembershipList(id, port, heartbeat);

    //send membership list to requester
    sendMembershipList(&requesterAddress, JOINREP);

    cout << "...end joinReqHandler." << endl;
    return true;
}